

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenType BinaryenTypeCreate(BinaryenType *types,BinaryenIndex numTypes)

{
  Type TVar1;
  BinaryenIndex i;
  ulong uVar2;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> typeVec;
  Type local_38;
  
  auStack_58 = (undefined1  [8])0x0;
  typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  typeVec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,(ulong)numTypes);
  for (uVar2 = 0; numTypes != uVar2; uVar2 = uVar2 + 1) {
    local_38.id = types[uVar2];
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,&local_38);
  }
  wasm::Type::Type(&local_38,(Tuple *)auStack_58);
  TVar1.id = local_38.id;
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58);
  return TVar1.id;
}

Assistant:

BinaryenType BinaryenTypeCreate(BinaryenType* types, BinaryenIndex numTypes) {
  std::vector<Type> typeVec;
  typeVec.reserve(numTypes);
  for (BinaryenIndex i = 0; i < numTypes; ++i) {
    typeVec.push_back(Type(types[i]));
  }
  return Type(typeVec).getID();
}